

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<no_dot_var_in_port_connection::MainVisitor&>
          (RangeSelectExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visit<no_dot_var_in_port_connection::MainVisitor&>(this->value_,visitor);
  Expression::visit<no_dot_var_in_port_connection::MainVisitor&>(this->left_,visitor);
  Expression::visit<no_dot_var_in_port_connection::MainVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }